

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000018e160 = 0x2e2e2e2e2e2e2e;
    uRam000000000018e167._0_1_ = '.';
    uRam000000000018e167._1_1_ = '.';
    uRam000000000018e167._2_1_ = '.';
    uRam000000000018e167._3_1_ = '.';
    uRam000000000018e167._4_1_ = '.';
    uRam000000000018e167._5_1_ = '.';
    uRam000000000018e167._6_1_ = '.';
    uRam000000000018e167._7_1_ = '.';
    DAT_0018e150 = '.';
    DAT_0018e150_1._0_1_ = '.';
    DAT_0018e150_1._1_1_ = '.';
    DAT_0018e150_1._2_1_ = '.';
    DAT_0018e150_1._3_1_ = '.';
    DAT_0018e150_1._4_1_ = '.';
    DAT_0018e150_1._5_1_ = '.';
    DAT_0018e150_1._6_1_ = '.';
    uRam000000000018e158 = 0x2e2e2e2e2e2e2e;
    DAT_0018e15f = 0x2e;
    DAT_0018e140 = '.';
    DAT_0018e140_1._0_1_ = '.';
    DAT_0018e140_1._1_1_ = '.';
    DAT_0018e140_1._2_1_ = '.';
    DAT_0018e140_1._3_1_ = '.';
    DAT_0018e140_1._4_1_ = '.';
    DAT_0018e140_1._5_1_ = '.';
    DAT_0018e140_1._6_1_ = '.';
    uRam000000000018e148._0_1_ = '.';
    uRam000000000018e148._1_1_ = '.';
    uRam000000000018e148._2_1_ = '.';
    uRam000000000018e148._3_1_ = '.';
    uRam000000000018e148._4_1_ = '.';
    uRam000000000018e148._5_1_ = '.';
    uRam000000000018e148._6_1_ = '.';
    uRam000000000018e148._7_1_ = '.';
    DAT_0018e130 = '.';
    DAT_0018e130_1._0_1_ = '.';
    DAT_0018e130_1._1_1_ = '.';
    DAT_0018e130_1._2_1_ = '.';
    DAT_0018e130_1._3_1_ = '.';
    DAT_0018e130_1._4_1_ = '.';
    DAT_0018e130_1._5_1_ = '.';
    DAT_0018e130_1._6_1_ = '.';
    uRam000000000018e138._0_1_ = '.';
    uRam000000000018e138._1_1_ = '.';
    uRam000000000018e138._2_1_ = '.';
    uRam000000000018e138._3_1_ = '.';
    uRam000000000018e138._4_1_ = '.';
    uRam000000000018e138._5_1_ = '.';
    uRam000000000018e138._6_1_ = '.';
    uRam000000000018e138._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000018e128._0_1_ = '.';
    uRam000000000018e128._1_1_ = '.';
    uRam000000000018e128._2_1_ = '.';
    uRam000000000018e128._3_1_ = '.';
    uRam000000000018e128._4_1_ = '.';
    uRam000000000018e128._5_1_ = '.';
    uRam000000000018e128._6_1_ = '.';
    uRam000000000018e128._7_1_ = '.';
    DAT_0018e16f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}